

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O3

type cm::operator==(static_string_view *l,
                   StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   *r)

{
  size_t __n;
  char *__s1;
  int iVar1;
  type tVar2;
  size_type __rlen;
  string local_48;
  
  __n = (l->super_string_view)._M_len;
  __s1 = (l->super_string_view)._M_str;
  StringOpPlus::operator_cast_to_string(&local_48,(StringOpPlus *)r);
  if (__n == local_48._M_string_length) {
    if (__n != 0) {
      iVar1 = bcmp(__s1,local_48._M_dataplus._M_p,__n);
      if (iVar1 != 0) goto LAB_00190573;
    }
    tVar2 = true;
  }
  else {
LAB_00190573:
    tVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return tVar2;
}

Assistant:

static string_view view(static_string_view const& s) { return s; }